

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMinAbsUnscaled
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int i)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  element_type *this_00;
  int in_ECX;
  int __c;
  long in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abs;
  int j;
  int exp2;
  int exp1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rowVec;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *min;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined7 in_stack_fffffffffffffd70;
  byte in_stack_fffffffffffffd77;
  double in_stack_fffffffffffffd78;
  DataArray<int> *this_01;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  undefined1 *eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffda8;
  int exp;
  undefined4 in_stack_fffffffffffffdb0;
  uint uVar4;
  undefined1 local_220 [20];
  undefined1 local_20c [56];
  undefined1 local_1d4 [56];
  undefined1 local_19c [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_164;
  undefined1 local_12c [56];
  undefined1 local_f4 [56];
  uint local_bc;
  int local_b8;
  int local_b4;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  DataArray<int> *local_a8;
  DataArray<int> *local_a0;
  int local_94;
  undefined8 local_78;
  undefined8 local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_a0 = *(DataArray<int> **)(in_RSI + 0x10);
  local_a8 = *(DataArray<int> **)(in_RSI + 0x18);
  local_94 = in_ECX;
  local_b0 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::rowVector((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                         in_stack_fffffffffffffd6c);
  local_70 = infinity();
  local_78 = 0;
  local_20 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
             (type *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  piVar2 = DataArray<int>::operator[](local_a8,local_94);
  local_b8 = *piVar2;
  local_bc = 0;
  while( true ) {
    exp = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    uVar4 = local_bc;
    iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(local_b0);
    if (iVar1 <= (int)uVar4) break;
    this_01 = local_a0;
    pcVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_b0,(char *)(ulong)local_bc,__c);
    piVar2 = DataArray<int>::operator[](this_01,(int)pcVar3);
    local_b4 = *piVar2;
    local_60 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_b0,local_bc);
    local_58 = local_19c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    a = &local_164;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(uVar4,in_stack_fffffffffffffdb0),exp);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
              (a);
    local_18 = local_12c;
    local_10 = local_f4;
    local_8 = local_12c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_48 = local_1d4;
    local_50 = local_f4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_38 = local_20c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    eps = local_220;
    tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3b384a);
    in_stack_fffffffffffffda8 =
         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)Tolerances::epsilon(this_00);
    in_stack_fffffffffffffd77 =
         LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                   ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(uVar4,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8,
                    (double)eps);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3b3885);
    if ((in_stack_fffffffffffffd77 & 1) != 0) {
      local_30 = local_f4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    local_bc = local_bc + 1;
  }
  return in_RDI;
}

Assistant:

R SPxScaler<R>::getRowMinAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R min = R(infinity);

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(LT(abs, min, this->tolerances()->epsilon()))
         min = abs;
   }

   return min;
}